

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::legacy_tex_op
          (CompilerGLSL *this,string *op,SPIRType *imgtype,uint32_t tex)

{
  bool bVar1;
  char *pcVar2;
  CompilerError *pCVar3;
  undefined4 in_register_0000000c;
  uint32_t in_R8D;
  char *local_328;
  char *local_318;
  byte local_2f1;
  byte local_283;
  byte local_282;
  byte local_281;
  spirv_cross local_258 [32];
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  undefined4 local_210;
  allocator local_209;
  string local_208 [8];
  string type_prefix;
  allocator local_1e1;
  string local_1e0 [5];
  bool is_es_and_depth;
  allocator local_1b9;
  string local_1b8 [38];
  undefined1 local_192;
  allocator local_191;
  string local_190 [38];
  undefined1 local_16a;
  allocator local_169;
  string local_168 [39];
  undefined1 local_141;
  spirv_cross local_140 [39];
  allocator local_119;
  string local_118 [38];
  byte local_f2;
  allocator local_f1;
  string local_f0 [6];
  bool is_comparison;
  undefined1 local_c9;
  spirv_cross local_c8 [39];
  allocator local_a1;
  string local_a0 [55];
  allocator local_69;
  string local_68 [32];
  SPIREntryPoint *local_48;
  SPIREntryPoint *execution;
  char *pcStack_38;
  bool legacy_lod_ext;
  char *type;
  SPIRType *pSStack_28;
  uint32_t tex_local;
  SPIRType *imgtype_local;
  string *op_local;
  CompilerGLSL *this_local;
  
  pSStack_28 = (SPIRType *)CONCAT44(in_register_0000000c,tex);
  switch((pSStack_28->image).dim) {
  case Dim1D:
    if (((byte)op[0x1dd8] & 1) == 0) {
      local_282 = 0;
      if (((pSStack_28->image).arrayed & 1U) != 0) {
        local_282 = (byte)op[0x1dd8] ^ 0xff;
      }
      pcStack_38 = "1D";
      if ((local_282 & 1) != 0) {
        pcStack_38 = "1DArray";
      }
    }
    else {
      local_281 = 0;
      if (((pSStack_28->image).arrayed & 1U) != 0) {
        local_281 = (byte)op[0x1dd8] ^ 0xff;
      }
      pcStack_38 = "2D";
      if ((local_281 & 1) != 0) {
        pcStack_38 = "2DArray";
      }
    }
    break;
  case Dim2D:
    local_283 = 0;
    if (((pSStack_28->image).arrayed & 1U) != 0) {
      local_283 = (byte)op[0x1dd8] ^ 0xff;
    }
    pcStack_38 = "2D";
    if ((local_283 & 1) != 0) {
      pcStack_38 = "2DArray";
    }
    break;
  case Dim3D:
    pcStack_38 = "3D";
    break;
  case DimCube:
    pcStack_38 = "Cube";
    break;
  case DimRect:
    pcStack_38 = "2DRect";
    break;
  case DimBuffer:
    pcStack_38 = "Buffer";
    break;
  case DimSubpassData:
    pcStack_38 = "2D";
    break;
  default:
    pcStack_38 = "";
  }
  execution._7_1_ = 0;
  type._4_4_ = in_R8D;
  imgtype_local = imgtype;
  op_local = op;
  this_local = this;
  local_48 = Compiler::get_entry_point((Compiler *)op);
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            imgtype_local,"textureGrad");
  if (((bVar1) ||
      (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)imgtype_local,"textureProjGrad"), bVar1)) ||
     (((bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)imgtype_local,"textureLod"), bVar1 ||
       (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)imgtype_local,"textureProjLod"), bVar1)) &&
      (local_48->model != ExecutionModelVertex)))) {
    bVar1 = is_legacy_es((CompilerGLSL *)op);
    if (bVar1) {
      execution._7_1_ = 1;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_68,"GL_EXT_shader_texture_lod",&local_69);
      require_extension_internal((CompilerGLSL *)op,(string *)local_68);
      ::std::__cxx11::string::~string(local_68);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_69);
    }
    else {
      bVar1 = is_legacy_desktop((CompilerGLSL *)op);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_a0,"GL_ARB_shader_texture_lod",&local_a1);
        require_extension_internal((CompilerGLSL *)op,(string *)local_a0);
        ::std::__cxx11::string::~string(local_a0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      }
    }
  }
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            imgtype_local,"textureLodOffset");
  if ((bVar1) ||
     (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )imgtype_local,"textureProjLodOffset"), bVar1)) {
    bVar1 = is_legacy_es((CompilerGLSL *)op);
    if (bVar1) {
      local_c9 = 1;
      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
      join<std::__cxx11::string_const&,char_const(&)[26]>
                (local_c8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          imgtype_local,(char (*) [26])" not allowed in legacy ES");
      CompilerError::CompilerError(pCVar3,(string *)local_c8);
      local_c9 = 0;
      __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_f0,"GL_EXT_gpu_shader4",&local_f1);
    require_extension_internal((CompilerGLSL *)op,(string *)local_f0);
    ::std::__cxx11::string::~string(local_f0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  }
  local_f2 = Compiler::is_depth_image((Compiler *)op,pSStack_28,type._4_4_);
  if (((bool)local_f2) && (bVar1 = is_legacy_es((CompilerGLSL *)op), bVar1)) {
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              imgtype_local,"texture");
    if ((!bVar1) &&
       (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)imgtype_local,"textureProj"), !bVar1)) {
      local_141 = 1;
      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
      join<std::__cxx11::string_const&,char_const(&)[44]>
                (local_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)imgtype_local,
                 (char (*) [44])" not allowed on depth samplers in legacy ES");
      CompilerError::CompilerError(pCVar3,(string *)local_140);
      local_141 = 0;
      __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_118,"GL_EXT_shadow_samplers",&local_119);
    require_extension_internal((CompilerGLSL *)op,(string *)local_118);
    ::std::__cxx11::string::~string(local_118);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_119);
  }
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            imgtype_local,"textureSize");
  if (bVar1) {
    bVar1 = is_legacy_es((CompilerGLSL *)op);
    if (bVar1) {
      local_16a = 1;
      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_168,"textureSize not supported in legacy ES",&local_169);
      CompilerError::CompilerError(pCVar3,(string *)local_168);
      local_16a = 0;
      __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((local_f2 & 1) != 0) {
      local_192 = 1;
      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_190,"textureSize not supported on shadow sampler in legacy GLSL",&local_191);
      CompilerError::CompilerError(pCVar3,(string *)local_190);
      local_192 = 0;
      __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_1b8,"GL_EXT_gpu_shader4",&local_1b9);
    require_extension_internal((CompilerGLSL *)op,(string *)local_1b8);
    ::std::__cxx11::string::~string(local_1b8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  }
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            imgtype_local,"texelFetch");
  if ((bVar1) && (bVar1 = is_legacy_es((CompilerGLSL *)op), bVar1)) {
    pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_1e0,"texelFetch not supported in legacy ES",&local_1e1);
    CompilerError::CompilerError(pCVar3,(string *)local_1e0);
    __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  bVar1 = is_legacy_es((CompilerGLSL *)op);
  local_2f1 = 0;
  if (bVar1) {
    local_2f1 = local_f2;
  }
  pcVar2 = "texture";
  if ((local_f2 & 1) != 0) {
    pcVar2 = "shadow";
  }
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_208,pcVar2,&local_209);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_209);
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            imgtype_local,"texture");
  if (bVar1) {
    if ((local_2f1 & 1) == 0) {
      join<std::__cxx11::string&,char_const*&>
                ((spirv_cross *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                 &stack0xffffffffffffffc8);
    }
    else {
      join<std::__cxx11::string&,char_const*&,char_const(&)[4]>
                ((spirv_cross *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                 &stack0xffffffffffffffc8,(char (*) [4])0x5b24cf);
    }
  }
  else {
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              imgtype_local,"textureLod");
    if (bVar1) {
      local_218 = "Lod";
      if ((execution._7_1_ & 1) != 0) {
        local_218 = "LodEXT";
      }
      join<std::__cxx11::string&,char_const*&,char_const*>
                ((spirv_cross *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                 &stack0xffffffffffffffc8,&local_218);
    }
    else {
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )imgtype_local,"textureProj");
      if (bVar1) {
        local_220 = "Proj";
        if ((local_2f1 & 1) != 0) {
          local_220 = "ProjEXT";
        }
        join<std::__cxx11::string&,char_const*&,char_const*>
                  ((spirv_cross *)this,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                   &stack0xffffffffffffffc8,&local_220);
      }
      else {
        bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)imgtype_local,"textureGrad");
        if (bVar1) {
          bVar1 = is_legacy_es((CompilerGLSL *)op);
          if (bVar1) {
            local_318 = "GradEXT";
          }
          else {
            bVar1 = is_legacy_desktop((CompilerGLSL *)op);
            local_318 = "Grad";
            if (bVar1) {
              local_318 = "GradARB";
            }
          }
          local_228 = local_318;
          join<std::__cxx11::string&,char_const*&,char_const*>
                    ((spirv_cross *)this,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                     &stack0xffffffffffffffc8,&local_228);
        }
        else {
          bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)imgtype_local,"textureProjLod");
          if (bVar1) {
            local_230 = "ProjLod";
            if ((execution._7_1_ & 1) != 0) {
              local_230 = "ProjLodEXT";
            }
            join<std::__cxx11::string&,char_const*&,char_const*>
                      ((spirv_cross *)this,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_208,&stack0xffffffffffffffc8,&local_230);
          }
          else {
            bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)imgtype_local,"textureLodOffset");
            if (bVar1) {
              join<std::__cxx11::string&,char_const*&,char_const(&)[10]>
                        ((spirv_cross *)this,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_208,&stack0xffffffffffffffc8,(char (*) [10])0x5af00d);
            }
            else {
              bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)imgtype_local,"textureProjGrad");
              if (bVar1) {
                bVar1 = is_legacy_es((CompilerGLSL *)op);
                if (bVar1) {
                  local_328 = "ProjGradEXT";
                }
                else {
                  bVar1 = is_legacy_desktop((CompilerGLSL *)op);
                  local_328 = "ProjGrad";
                  if (bVar1) {
                    local_328 = "ProjGradARB";
                  }
                }
                local_238 = local_328;
                join<std::__cxx11::string&,char_const*&,char_const*>
                          ((spirv_cross *)this,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_208,&stack0xffffffffffffffc8,&local_238);
              }
              else {
                bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)imgtype_local,"textureProjLodOffset");
                if (bVar1) {
                  join<std::__cxx11::string&,char_const*&,char_const(&)[14]>
                            ((spirv_cross *)this,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_208,&stack0xffffffffffffffc8,(char (*) [14])0x5af06d);
                }
                else {
                  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)imgtype_local,"textureSize");
                  if (bVar1) {
                    join<char_const(&)[12],char_const*&>
                              ((spirv_cross *)this,(char (*) [12])"textureSize",
                               &stack0xffffffffffffffc8);
                  }
                  else {
                    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)imgtype_local,"texelFetch");
                    if (!bVar1) {
                      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
                      join<char_const(&)[32],std::__cxx11::string_const&>
                                (local_258,(char (*) [32])"Unsupported legacy texture op: ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)imgtype_local);
                      CompilerError::CompilerError(pCVar3,(string *)local_258);
                      __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
                    }
                    join<char_const(&)[11],char_const*&>
                              ((spirv_cross *)this,(char (*) [11])"texelFetch",
                               &stack0xffffffffffffffc8);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  local_210 = 1;
  ::std::__cxx11::string::~string(local_208);
  return this;
}

Assistant:

string CompilerGLSL::legacy_tex_op(const std::string &op, const SPIRType &imgtype, uint32_t tex)
{
	const char *type;
	switch (imgtype.image.dim)
	{
	case spv::Dim1D:
		// Force 2D path for ES.
		if (options.es)
			type = (imgtype.image.arrayed && !options.es) ? "2DArray" : "2D";
		else
			type = (imgtype.image.arrayed && !options.es) ? "1DArray" : "1D";
		break;
	case spv::Dim2D:
		type = (imgtype.image.arrayed && !options.es) ? "2DArray" : "2D";
		break;
	case spv::Dim3D:
		type = "3D";
		break;
	case spv::DimCube:
		type = "Cube";
		break;
	case spv::DimRect:
		type = "2DRect";
		break;
	case spv::DimBuffer:
		type = "Buffer";
		break;
	case spv::DimSubpassData:
		type = "2D";
		break;
	default:
		type = "";
		break;
	}

	// In legacy GLSL, an extension is required for textureLod in the fragment
	// shader or textureGrad anywhere.
	bool legacy_lod_ext = false;
	auto &execution = get_entry_point();
	if (op == "textureGrad" || op == "textureProjGrad" ||
	    ((op == "textureLod" || op == "textureProjLod") && execution.model != ExecutionModelVertex))
	{
		if (is_legacy_es())
		{
			legacy_lod_ext = true;
			require_extension_internal("GL_EXT_shader_texture_lod");
		}
		else if (is_legacy_desktop())
			require_extension_internal("GL_ARB_shader_texture_lod");
	}

	if (op == "textureLodOffset" || op == "textureProjLodOffset")
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW(join(op, " not allowed in legacy ES"));

		require_extension_internal("GL_EXT_gpu_shader4");
	}

	// GLES has very limited support for shadow samplers.
	// Basically shadow2D and shadow2DProj work through EXT_shadow_samplers,
	// everything else can just throw
	bool is_comparison = is_depth_image(imgtype, tex);
	if (is_comparison && is_legacy_es())
	{
		if (op == "texture" || op == "textureProj")
			require_extension_internal("GL_EXT_shadow_samplers");
		else
			SPIRV_CROSS_THROW(join(op, " not allowed on depth samplers in legacy ES"));
	}

	if (op == "textureSize")
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW("textureSize not supported in legacy ES");
		if (is_comparison)
			SPIRV_CROSS_THROW("textureSize not supported on shadow sampler in legacy GLSL");
		require_extension_internal("GL_EXT_gpu_shader4");
	}

	if (op == "texelFetch" && is_legacy_es())
		SPIRV_CROSS_THROW("texelFetch not supported in legacy ES");

	bool is_es_and_depth = is_legacy_es() && is_comparison;
	std::string type_prefix = is_comparison ? "shadow" : "texture";

	if (op == "texture")
		return is_es_and_depth ? join(type_prefix, type, "EXT") : join(type_prefix, type);
	else if (op == "textureLod")
		return join(type_prefix, type, legacy_lod_ext ? "LodEXT" : "Lod");
	else if (op == "textureProj")
		return join(type_prefix, type, is_es_and_depth ? "ProjEXT" : "Proj");
	else if (op == "textureGrad")
		return join(type_prefix, type, is_legacy_es() ? "GradEXT" : is_legacy_desktop() ? "GradARB" : "Grad");
	else if (op == "textureProjLod")
		return join(type_prefix, type, legacy_lod_ext ? "ProjLodEXT" : "ProjLod");
	else if (op == "textureLodOffset")
		return join(type_prefix, type, "LodOffset");
	else if (op == "textureProjGrad")
		return join(type_prefix, type,
		            is_legacy_es() ? "ProjGradEXT" : is_legacy_desktop() ? "ProjGradARB" : "ProjGrad");
	else if (op == "textureProjLodOffset")
		return join(type_prefix, type, "ProjLodOffset");
	else if (op == "textureSize")
		return join("textureSize", type);
	else if (op == "texelFetch")
		return join("texelFetch", type);
	else
	{
		SPIRV_CROSS_THROW(join("Unsupported legacy texture op: ", op));
	}
}